

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          *samples)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pRVar2;
  pointer pfVar3;
  undefined8 uVar4;
  pointer pVVar5;
  deUint64 *pdVar6;
  int *piVar7;
  pointer pRVar8;
  SampleBuilder *pSVar9;
  uint uVar10;
  ulong target;
  long lVar11;
  int endNdx;
  size_type __n;
  ulong uVar12;
  pointer pfVar13;
  undefined1 auVar14 [8];
  long lVar15;
  undefined1 auVar16 [8];
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  RenderSampleAnalyzeResult RVar23;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew_6;
  LineParametersWithConfidence contributionFitting;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_8;
  size_type __dnew_4;
  ScopedLogSection section_1;
  size_type __dnew_9;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_2;
  ScopedLogSection section;
  undefined1 local_a78 [12];
  float fStack_a6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  undefined1 local_a10 [8];
  undefined8 local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a00;
  string local_9f0;
  string local_9d0;
  qpSampleValueTag local_9b0;
  float local_9ac;
  LogNumber<float> local_9a8;
  float local_940;
  float local_93c;
  float local_938;
  float local_934;
  undefined1 local_930 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  LogNumber<float> local_910;
  LogNumber<float> local_8a8;
  float local_840;
  float local_83c;
  LogNumber<float> local_838;
  LogNumber<float> local_7d0;
  LogNumber<float> local_768;
  string local_700;
  string local_6e0;
  LogNumber<float> local_6c0;
  LogNumber<float> local_658;
  LogNumber<float> local_5f0;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  LogNumber<float> local_4e8;
  LineParametersWithConfidence local_47c;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  undefined1 local_158 [16];
  ScopedLogSection local_140;
  string local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (&local_47c,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a10,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)local_a78);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) *
        -0x71c71c71c71c71c7;
  uVar10 = (uint)__n;
  if (0 < (int)uVar10) {
    pdVar6 = &(pRVar8->duration).fitResponseDuration;
    uVar12 = 0;
    do {
      *(deUint64 *)((long)local_a10 + uVar12 * 8) = *pdVar6;
      uVar12 = uVar12 + 1;
      pdVar6 = pdVar6 + 9;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,__n,(allocator_type *)&local_9a8);
  uVar4 = local_a78._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar12 * 4) =
           (float)*piVar7 / (((float)*(ulong *)((long)local_a10 + uVar12 * 8) / 1000.0) / 1000.0);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  pfVar13 = (pointer)local_a78._0_8_;
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
    pfVar13 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  }
  uVar4 = local_a78._0_8_;
  local_934 = (float)(((long)pfVar13 - local_a78._0_8_ >> 2) - 1) * 0.5;
  fVar18 = floorf(local_934);
  fVar19 = local_934 - (float)(int)fVar18;
  local_934 = fVar19 * *(float *)(uVar4 + (long)((int)fVar18 + 1) * 4);
  local_f8 = ZEXT416((uint)((1.0 - fVar19) * *(float *)(uVar4 + (long)(int)fVar18 * 4)));
  operator_delete((void *)uVar4,local_a68._M_allocated_capacity - uVar4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_9a8);
  uVar4 = local_a78._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar12 * 4) =
           (float)*(ulong *)((long)local_a10 + uVar12 * 8) -
           ((float)*piVar7 * local_47c.coefficient + local_47c.offset);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_9a8);
  uVar4 = local_a78._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      fVar18 = (float)*piVar7 * local_47c.coefficient + local_47c.offset;
      fVar19 = 0.0;
      if (1.0 <= fVar18) {
        fVar19 = ((float)*(ulong *)((long)local_a10 + uVar12 * 8) - fVar18) / fVar18;
      }
      *(float *)(local_a78._0_8_ + uVar12 * 4) = fVar19;
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  pVVar5 = local_a08;
  auVar14 = local_a10;
  auVar16 = local_a10;
  if (local_a10 != (undefined1  [8])local_a08) {
    uVar12 = (long)local_a08 - (long)local_a10 >> 3;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a10,local_a08,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar14,pVVar5);
    auVar14 = (undefined1  [8])local_a08;
    auVar16 = local_a10;
  }
  local_15c = (float)(((long)auVar14 - (long)auVar16 >> 3) - 1) * 0.5;
  local_48 = floorf(local_15c);
  uVar12 = *(ulong *)((long)auVar16 + (long)(int)local_48 * 8);
  target = uVar12;
  if ((long)uVar12 < 0) {
    target = (ulong)((uint)uVar12 & 1) | uVar12 >> 1;
  }
  local_83c = (float)uVar12;
  uVar12 = *(ulong *)((long)auVar16 + (long)((int)local_48 + 1) * 8);
  if ((long)uVar12 < 0) {
    target = uVar12 >> 1;
  }
  local_840 = (float)uVar12;
  operator_delete((void *)auVar16,aStack_a00._M_allocated_capacity - (long)auVar16);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x0,target);
  local_938 = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x8,target);
  local_108._0_4_ = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)&DAT_00000010,target);
  local_93c = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x18,target);
  local_118._0_4_ = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x20,target);
  local_940 = (float)local_a08;
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Samples","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_138,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  local_4e8.m_name._M_dataplus._M_p = (pointer)&local_4e8.m_name.field_2;
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x6153;
  local_4e8.m_name.field_2._M_local_buf[2] = 'm';
  local_4e8.m_name.field_2._M_allocated_capacity._3_4_ = 0x73656c70;
  local_4e8.m_name._M_string_length = 7;
  local_4e8.m_name.field_2._M_local_buf[7] = '\0';
  local_920._M_allocated_capacity._0_4_ = 0x706d6153;
  local_930._8_8_ = 7;
  local_920._M_allocated_capacity._4_4_ = 0x73656c;
  local_930._0_8_ = &local_920;
  tcu::LogSampleList::LogSampleList
            ((LogSampleList *)&local_6c0,&local_4e8.m_name,(string *)local_930);
  tcu::TestLog::startSampleList(log,&local_6c0.m_name,&local_6c0.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_588.field_2._M_allocated_capacity = 0x657a695361746144;
  local_588._M_string_length = 8;
  local_588.field_2._M_local_buf[8] = '\0';
  local_1a0.field_2._M_allocated_capacity._0_6_ = 0x702061746144;
  local_1a0.field_2._M_allocated_capacity._6_2_ = 0x6f72;
  local_1a0.field_2._8_6_ = 0x646573736563;
  local_1a0._M_string_length = 0xe;
  local_1a0.field_2._M_local_buf[0xe] = '\0';
  local_1c0.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_1c0.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_1c0._M_string_length = 5;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a10,&local_588,&local_1a0,&local_1c0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a10,&local_9f0,&local_9d0,local_9b0);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0.field_2._M_allocated_capacity = 0x695364616f6c7055;
  local_1e0.field_2._8_2_ = 0x657a;
  local_1e0._M_string_length = 10;
  local_1e0.field_2._M_local_buf[10] = '\0';
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200.field_2._M_allocated_capacity._0_5_ = 0x2061746144;
  local_200.field_2._M_allocated_capacity._5_3_ = 0x6c7075;
  local_200.field_2._8_5_ = 0x646564616f;
  local_200._M_string_length = 0xd;
  local_200.field_2._M_local_buf[0xd] = '\0';
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_220.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_220.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_220._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,&local_1e0,&local_200,&local_220,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240.field_2._M_allocated_capacity._0_7_ = 0x43786574726556;
  local_240.field_2._7_4_ = 0x746e756f;
  local_240._M_string_length = 0xb;
  local_240.field_2._M_local_buf[0xb] = '\0';
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_7d0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_508._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_7d0);
  local_508.field_2._M_allocated_capacity = (size_type)local_7d0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_508._M_dataplus._M_p,"Number of vertices",0x12);
  local_508._M_string_length = (size_type)local_7d0.m_name._M_dataplus._M_p;
  local_508._M_dataplus._M_p[(long)local_7d0.m_name._M_dataplus._M_p] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260.field_2._M_allocated_capacity = 0x7365636974726576;
  local_260._M_string_length = 8;
  local_260.field_2._M_local_buf[8] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_9a8,&local_240,&local_508,&local_260,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            (log,&local_9a8.m_name,&local_9a8.m_desc,&local_9a8.m_unit,local_9a8.m_tag);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280.field_2._M_allocated_capacity = 0x6461655277617244;
  local_280.field_2._8_4_ = 0x656d6954;
  local_280._M_string_length = 0xc;
  local_280.field_2._M_local_buf[0xc] = '\0';
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_838.m_name._M_dataplus._M_p = (pointer)0x24;
  local_528._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_838);
  local_528.field_2._M_allocated_capacity = (size_type)local_838.m_name._M_dataplus._M_p;
  builtin_strncpy(local_528._M_dataplus._M_p,"Second draw call and ReadPixels time",0x24);
  local_528._M_string_length = (size_type)local_838.m_name._M_dataplus._M_p;
  local_528._M_dataplus._M_p[(long)local_838.m_name._M_dataplus._M_p] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_2a0._M_string_length = 2;
  local_2a0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7d0,&local_280,&local_528,&local_2a0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_7d0.m_name,&local_7d0.m_desc,&local_7d0.m_unit,local_7d0.m_tag);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_2c0.field_2._8_2_ = 0x65;
  local_2c0._M_string_length = 9;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_2e0.field_2._8_2_ = 0x656d;
  local_2e0._M_string_length = 10;
  local_2e0.field_2._M_local_buf[10] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_300.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_300._M_string_length = 2;
  local_300.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_838,&local_2c0,&local_2e0,&local_300,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_838.m_name,&local_838.m_desc,&local_838.m_unit,local_838.m_tag);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  local_910.m_name._M_dataplus._M_p = (pointer)0x11;
  local_6e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_910);
  local_6e0.field_2._M_allocated_capacity = (size_type)local_910.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6e0._M_dataplus._M_p,"FirstDrawCallTime",0x11);
  local_6e0._M_string_length = (size_type)local_910.m_name._M_dataplus._M_p;
  local_6e0._M_dataplus._M_p[(long)local_910.m_name._M_dataplus._M_p] = '\0';
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  local_910.m_name._M_dataplus._M_p = (pointer)0x14;
  local_548._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)&local_910);
  local_548.field_2._M_allocated_capacity = (size_type)local_910.m_name._M_dataplus._M_p;
  builtin_strncpy(local_548._M_dataplus._M_p,"First draw call time",0x14);
  local_548._M_string_length = (size_type)local_910.m_name._M_dataplus._M_p;
  local_548._M_dataplus._M_p[(long)local_910.m_name._M_dataplus._M_p] = '\0';
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_320._M_string_length = 2;
  local_320.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5f0,&local_6e0,&local_548,&local_320,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_5f0.m_name,&local_5f0.m_desc,&local_5f0.m_unit,local_5f0.m_tag);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_340.field_2._7_4_ = 0x656d6974;
  local_340._M_string_length = 0xb;
  local_340.field_2._M_local_buf[0xb] = '\0';
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_360.field_2._7_4_ = 0x656d6974;
  local_360._M_string_length = 0xb;
  local_360.field_2._M_local_buf[0xb] = '\0';
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  local_380.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_380._M_string_length = 2;
  local_380.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_910,&local_340,&local_360,&local_380,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_910.m_name,&local_910.m_desc,&local_910.m_unit,local_910.m_tag);
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x12;
  local_700._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_700,(ulong)&local_658);
  local_700.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_700._M_dataplus._M_p,"SecondDrawCallTime",0x12);
  local_700._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_700._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x15;
  local_568._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_658);
  local_568.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_568._M_dataplus._M_p,"Second draw call time",0x15);
  local_568._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_568._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  local_3a0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3a0._M_string_length = 2;
  local_3a0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_768,&local_700,&local_568,&local_3a0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_768.m_name,&local_768.m_desc,&local_768.m_unit,local_768.m_tag);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  local_3c0.field_2._M_allocated_capacity = 0x656d695464616552;
  local_3c0._M_string_length = 8;
  local_3c0.field_2._M_local_buf[8] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_3e0.field_2._M_local_buf[7] = 'e';
  local_3e0.field_2._8_7_ = 0x656d697420736c;
  local_3e0._M_string_length = 0xf;
  local_3e0.field_2._M_local_buf[0xf] = '\0';
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_400._M_string_length = 2;
  local_400.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_658,&local_3c0,&local_3e0,&local_400,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_658.m_name,&local_658.m_desc,&local_658.m_unit,local_658.m_tag);
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_420.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_420.field_2._7_4_ = 0x6c617564;
  local_420._M_string_length = 0xb;
  local_420.field_2._M_local_buf[0xb] = '\0';
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  local_440.field_2._M_allocated_capacity = 0x6973657220746946;
  local_440.field_2._8_4_ = 0x6c617564;
  local_440._M_string_length = 0xc;
  local_440.field_2._M_local_buf[0xc] = '\0';
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_460.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_460._M_string_length = 2;
  local_460.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_8a8,&local_420,&local_440,&local_460,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_8a8.m_name,&local_8a8.m_desc,&local_8a8.m_unit,local_8a8.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_unit._M_dataplus._M_p != &local_8a8.m_unit.field_2) {
    operator_delete(local_8a8.m_unit._M_dataplus._M_p,
                    local_8a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_desc._M_dataplus._M_p != &local_8a8.m_desc.field_2) {
    operator_delete(local_8a8.m_desc._M_dataplus._M_p,
                    local_8a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,
                    CONCAT53(local_460.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_460.field_2._M_local_buf[2],
                                      local_460.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,
                    CONCAT17(local_420.field_2._M_local_buf[7],
                             local_420.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_unit._M_dataplus._M_p != &local_658.m_unit.field_2) {
    operator_delete(local_658.m_unit._M_dataplus._M_p,
                    local_658.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_desc._M_dataplus._M_p != &local_658.m_desc.field_2) {
    operator_delete(local_658.m_desc._M_dataplus._M_p,
                    local_658.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT53(local_400.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_400.field_2._M_local_buf[2],
                                      local_400.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT17(local_3e0.field_2._M_local_buf[7],
                             local_3e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_unit._M_dataplus._M_p != &local_768.m_unit.field_2) {
    operator_delete(local_768.m_unit._M_dataplus._M_p,
                    local_768.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_desc._M_dataplus._M_p != &local_768.m_desc.field_2) {
    operator_delete(local_768.m_desc._M_dataplus._M_p,
                    local_768.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,
                    CONCAT53(local_3a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3a0.field_2._M_local_buf[2],
                                      local_3a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,(ulong)(local_568.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,(ulong)(local_700.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_unit._M_dataplus._M_p != &local_910.m_unit.field_2) {
    operator_delete(local_910.m_unit._M_dataplus._M_p,
                    local_910.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_desc._M_dataplus._M_p != &local_910.m_desc.field_2) {
    operator_delete(local_910.m_desc._M_dataplus._M_p,
                    local_910.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_380.field_2._M_local_buf[2],
                                      local_380.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,
                    CONCAT17(local_360.field_2._M_local_buf[7],
                             local_360.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT17(local_340.field_2._M_local_buf[7],
                             local_340.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_unit._M_dataplus._M_p != &local_5f0.m_unit.field_2) {
    operator_delete(local_5f0.m_unit._M_dataplus._M_p,
                    local_5f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_desc._M_dataplus._M_p != &local_5f0.m_desc.field_2) {
    operator_delete(local_5f0.m_desc._M_dataplus._M_p,
                    local_5f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,
                    CONCAT53(local_320.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_320.field_2._M_local_buf[2],
                                      local_320.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,(ulong)(local_6e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,
                    CONCAT53(local_300.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_300.field_2._M_local_buf[2],
                                      local_300.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT53(local_2a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2a0.field_2._M_local_buf[2],
                                      local_2a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,(ulong)(local_508.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT17(local_240.field_2._M_local_buf[7],
                             local_240.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT26(local_220.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_220.field_2._M_allocated_capacity._4_2_,
                                      local_220.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT35(local_200.field_2._M_allocated_capacity._5_3_,
                             local_200.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT26(local_1c0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_1c0.field_2._M_allocated_capacity._4_2_,
                                      local_1c0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT26(local_1a0.field_2._M_allocated_capacity._6_2_,
                             local_1a0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_desc._M_dataplus._M_p != &local_6c0.m_desc.field_2) {
    operator_delete(local_6c0.m_desc._M_dataplus._M_p,
                    local_6c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT44(local_920._M_allocated_capacity._4_4_,
                             local_920._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != &local_4e8.m_name.field_2) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 3) *
          0x38e38e39) {
    lVar15 = 0;
    lVar11 = 0;
    do {
      uVar12 = *(ulong *)((long)&(pRVar8->duration).fitResponseDuration + lVar15);
      local_158._0_4_ =
           (float)*(int *)((long)&pRVar8->renderDataSize + lVar15) * local_47c.coefficient +
           local_47c.offset;
      local_a08 = (pointer)0x0;
      aStack_a00._M_allocated_capacity = 0;
      aStack_a00._8_8_ = 0;
      local_a10 = (undefined1  [8])log;
      pSVar9 = tcu::SampleBuilder::operator<<
                         ((SampleBuilder *)local_a10,
                          *(int *)((long)&pRVar8->renderDataSize + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 uploadedDataSize + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 numVertices + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).renderReadDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).totalDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).firstRenderDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).uploadDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).secondRenderDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).readDuration + lVar15));
      pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,(float)uVar12 - (float)local_158._0_4_);
      tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_a08 != (pointer)0x0) {
        operator_delete(local_a08,aStack_a00._8_8_ - (long)local_a08);
      }
      lVar11 = lVar11 + 1;
      pRVar8 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x48;
    } while (lVar11 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8
                                   ) >> 3) * 0x38e38e39);
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_138._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Contribution","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contributions","");
  paVar1 = &local_4e8.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_588,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,0);
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d0,"FirstDrawCallConstantCost","");
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"First DrawCall: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_7d0.m_name,&local_838.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (pointer)0x17;
  local_910.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_910,(ulong)&local_9a8);
  local_910.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9a8.m_name._M_dataplus._M_p,0);
  local_910.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x30);
  local_910.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_910.m_name._M_dataplus._M_p,"FirstDrawCallLinearCost",0x17);
  local_910.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_910.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (char *)0x28;
  local_768.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_9a8);
  local_768.m_name.field_2._M_allocated_capacity = (size_type)local_9a8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768.m_name._M_dataplus._M_p,"First DrawCall: Approximated linear cost",0x28)
  ;
  local_768.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_768.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_768.m_name,&local_658.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a8.m_name._M_dataplus._M_p = (pointer)&local_8a8.m_name.field_2;
  local_6c0.m_name._M_dataplus._M_p = (pointer)0x17;
  local_8a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8a8,(ulong)&local_6c0);
  local_8a8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_6c0.m_name._M_dataplus._M_p,0);
  local_8a8.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x30);
  local_8a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8a8.m_name._M_dataplus._M_p,"FirstDrawCallMedianCost",0x17);
  local_8a8.m_name._M_string_length = (size_type)local_6c0.m_name._M_dataplus._M_p;
  local_8a8.m_name._M_dataplus._M_p[(long)local_6c0.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_4e8.m_name._M_dataplus._M_p = (pointer)0x1b;
  local_6c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)&local_4e8);
  local_6c0.m_name.field_2._M_allocated_capacity = (size_type)local_4e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6c0.m_name._M_dataplus._M_p,"First DrawCall: Median cost",0x1b);
  local_6c0.m_name._M_string_length = (size_type)local_4e8.m_name._M_dataplus._M_p;
  local_6c0.m_name._M_dataplus._M_p[(long)local_4e8.m_name._M_dataplus._M_p] = '\0';
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e8.m_name._M_string_length = 2;
  local_4e8.m_name.field_2._M_local_buf[2] = '\0';
  local_4e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_8a8.m_name,&local_6c0.m_name,&local_4e8.m_name,QP_KEY_TAG_TIME,
             local_938);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,8);
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"UploadConstantCost","");
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"Upload: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_7d0.m_name,&local_838.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = &DAT_00000010;
  local_910.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_910,(ulong)&local_9a8);
  local_910.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9a8.m_name._M_dataplus._M_p,0);
  local_910.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x30);
  local_910.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_910.m_name._M_dataplus._M_p,"UploadLinearCost",0x10);
  local_910.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_910.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (char *)0x20;
  local_768.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_9a8);
  local_768.m_name.field_2._M_allocated_capacity = (size_type)local_9a8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768.m_name._M_dataplus._M_p,"Upload: Approximated linear cost",0x20);
  local_768.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_768.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_768.m_name,&local_658.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a8.m_name._M_dataplus._M_p = (pointer)&local_8a8.m_name.field_2;
  local_6c0.m_name._M_dataplus._M_p = &DAT_00000010;
  local_8a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8a8,(ulong)&local_6c0);
  local_8a8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_6c0.m_name._M_dataplus._M_p,0);
  local_8a8.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x30);
  local_8a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8a8.m_name._M_dataplus._M_p,"UploadMedianCost",0x10);
  local_8a8.m_name._M_string_length = (size_type)local_6c0.m_name._M_dataplus._M_p;
  local_8a8.m_name._M_dataplus._M_p[(long)local_6c0.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_4e8.m_name._M_dataplus._M_p = (pointer)0x13;
  local_6c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)&local_4e8);
  local_6c0.m_name.field_2._M_allocated_capacity = (size_type)local_4e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6c0.m_name._M_dataplus._M_p,"Upload: Median cost",0x13);
  local_6c0.m_name._M_string_length = (size_type)local_4e8.m_name._M_dataplus._M_p;
  local_6c0.m_name._M_dataplus._M_p[(long)local_4e8.m_name._M_dataplus._M_p] = '\0';
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e8.m_name._M_string_length = 2;
  local_4e8.m_name.field_2._M_local_buf[2] = '\0';
  local_4e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_8a8.m_name,&local_6c0.m_name,&local_4e8.m_name,QP_KEY_TAG_TIME,
             (float)local_108._0_4_);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x10);
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d0,"SecondDrawCallConstantCost","");
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"Second DrawCall: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_7d0.m_name,&local_838.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (pointer)0x18;
  local_910.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_910,(ulong)&local_9a8);
  local_910.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9a8.m_name._M_dataplus._M_p,0);
  local_910.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x30);
  local_910.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9a8.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_910.m_name._M_dataplus._M_p,"SecondDrawCallLinearCost",0x18);
  local_910.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_910.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (char *)0x29;
  local_768.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_9a8);
  local_768.m_name.field_2._M_allocated_capacity = (size_type)local_9a8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768.m_name._M_dataplus._M_p,"Second DrawCall: Approximated linear cost",0x29
                 );
  local_768.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_768.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_768.m_name,&local_658.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a8.m_name._M_dataplus._M_p = (pointer)&local_8a8.m_name.field_2;
  local_6c0.m_name._M_dataplus._M_p = (pointer)0x18;
  local_8a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8a8,(ulong)&local_6c0);
  local_8a8.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_6c0.m_name._M_dataplus._M_p,0);
  local_8a8.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x30);
  local_8a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_6c0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8a8.m_name._M_dataplus._M_p,"SecondDrawCallMedianCost",0x18);
  local_8a8.m_name._M_string_length = (size_type)local_6c0.m_name._M_dataplus._M_p;
  local_8a8.m_name._M_dataplus._M_p[(long)local_6c0.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_4e8.m_name._M_dataplus._M_p = (pointer)0x1c;
  local_6c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)&local_4e8);
  local_6c0.m_name.field_2._M_allocated_capacity = (size_type)local_4e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6c0.m_name._M_dataplus._M_p,"Second DrawCall: Median cost",0x1c);
  local_6c0.m_name._M_string_length = (size_type)local_4e8.m_name._M_dataplus._M_p;
  local_6c0.m_name._M_dataplus._M_p[(long)local_4e8.m_name._M_dataplus._M_p] = '\0';
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e8.m_name._M_string_length = 2;
  local_4e8.m_name.field_2._M_local_buf[2] = '\0';
  local_4e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_8a8.m_name,&local_6c0.m_name,&local_4e8.m_name,QP_KEY_TAG_TIME,
             local_93c);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x18);
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"ReadConstantCost","");
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"Read: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_7d0.m_name,&local_838.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_6_ = 0x694c64616552;
  local_910.m_name.field_2._M_local_buf[6] = 'n';
  local_910.m_name.field_2._M_local_buf[7] = 'e';
  local_910.m_name.field_2._8_6_ = 0x74736f437261;
  local_910.m_name._M_string_length = 0xe;
  local_910.m_name.field_2._M_local_buf[0xe] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (char *)0x1e;
  local_768.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_9a8);
  local_768.m_name.field_2._M_allocated_capacity = (size_type)local_9a8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768.m_name._M_dataplus._M_p,"Read: Approximated linear cost",0x1e);
  local_768.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_768.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_768.m_name,&local_658.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a8.m_name._M_dataplus._M_p = (pointer)&local_8a8.m_name.field_2;
  local_8a8.m_name.field_2._M_allocated_capacity._0_6_ = 0x654d64616552;
  local_8a8.m_name.field_2._M_local_buf[6] = 'd';
  local_8a8.m_name.field_2._M_local_buf[7] = 'i';
  local_8a8.m_name.field_2._8_6_ = 0x74736f436e61;
  local_8a8.m_name._M_string_length = 0xe;
  local_8a8.m_name.field_2._M_local_buf[0xe] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_4e8.m_name._M_dataplus._M_p = (pointer)0x11;
  local_6c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)&local_4e8);
  local_6c0.m_name.field_2._M_allocated_capacity = (size_type)local_4e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6c0.m_name._M_dataplus._M_p,"Read: Median cost",0x11);
  local_6c0.m_name._M_string_length = (size_type)local_4e8.m_name._M_dataplus._M_p;
  local_6c0.m_name._M_dataplus._M_p[(long)local_4e8.m_name._M_dataplus._M_p] = '\0';
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e8.m_name._M_string_length = 2;
  local_4e8.m_name.field_2._M_local_buf[2] = '\0';
  local_4e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_8a8.m_name,&local_6c0.m_name,&local_4e8.m_name,QP_KEY_TAG_TIME,
             (float)local_118._0_4_);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x20);
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"TotalConstantCost","");
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"Total: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_7d0.m_name,&local_838.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_6_ = 0x4c6c61746f54;
  local_910.m_name.field_2._M_local_buf[6] = 'i';
  local_910.m_name.field_2._M_local_buf[7] = 'n';
  local_910.m_name.field_2._8_6_ = 0x736f43726165;
  local_910.m_name.field_2._M_local_buf[0xe] = 't';
  local_910.m_name._M_string_length = 0xf;
  local_910.m_name.field_2._M_local_buf[0xf] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  local_9a8.m_name._M_dataplus._M_p = (char *)0x1f;
  local_768.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_9a8);
  local_768.m_name.field_2._M_allocated_capacity = (size_type)local_9a8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768.m_name._M_dataplus._M_p,"Total: Approximated linear cost",0x1f);
  local_768.m_name._M_string_length = (size_type)local_9a8.m_name._M_dataplus._M_p;
  local_768.m_name._M_dataplus._M_p[(long)local_9a8.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_768.m_name,&local_658.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a8.m_name._M_dataplus._M_p = (pointer)&local_8a8.m_name.field_2;
  local_8a8.m_name.field_2._M_allocated_capacity._0_6_ = 0x4d6c61746f54;
  local_8a8.m_name.field_2._M_local_buf[6] = 'e';
  local_8a8.m_name.field_2._M_local_buf[7] = 'd';
  local_8a8.m_name.field_2._8_6_ = 0x736f436e6169;
  local_8a8.m_name.field_2._M_local_buf[0xe] = 't';
  local_8a8.m_name._M_string_length = 0xf;
  local_8a8.m_name.field_2._M_local_buf[0xf] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_4e8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_6c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)&local_4e8);
  local_6c0.m_name.field_2._M_allocated_capacity = (size_type)local_4e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_6c0.m_name._M_dataplus._M_p,"Total: Median cost",0x12);
  local_6c0.m_name._M_string_length = (size_type)local_4e8.m_name._M_dataplus._M_p;
  local_6c0.m_name._M_dataplus._M_p[(long)local_4e8.m_name._M_dataplus._M_p] = '\0';
  local_4e8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e8.m_name._M_string_length = 2;
  local_4e8.m_name.field_2._M_local_buf[2] = '\0';
  local_4e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_8a8.m_name,&local_6c0.m_name,&local_4e8.m_name,QP_KEY_TAG_TIME,
             local_940);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_588._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Results","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_140,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar19 = (float)((pRVar2[-1].renderDataSize + pRVar8->renderDataSize) / 2);
  local_17c = local_47c.coefficient * fVar19;
  local_178 = local_47c.offset + local_17c;
  endNdx = ((int)((ulong)((long)pRVar2 - (long)pRVar8) >> 3) * 0x38e38e39) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a10,samples,0,endNdx,1,0x30);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x30);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar18 = (float)pRVar8->renderDataSize;
  local_938 = (float)pRVar2[-1].renderDataSize;
  local_158._0_4_ = fVar18;
  local_160 = (float)local_a10._0_4_;
  local_108 = ZEXT416((uint)local_a08._4_4_);
  local_940 = (float)local_a78._0_4_;
  local_118 = ZEXT416((uint)fStack_a6c);
  local_93c = getAreaBetweenLines(fVar18,local_938,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a10,samples,0,
             (int)((ulong)((long)pRVar2 - (long)pRVar8) >> 3) * 0x38e38e39,2,0x30);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,2,
             0x30);
  local_164 = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  local_168 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_174 = (float)local_a10._0_4_;
  local_58 = ZEXT416((uint)local_a08._4_4_);
  local_170 = (float)local_a78._0_4_;
  local_68 = ZEXT416((uint)fStack_a6c);
  local_16c = getAreaBetweenLines(local_164,local_168,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  local_930._0_8_ = &local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"ResultLinearity","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Sample linearity","");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"%","");
  fVar18 = (float)local_108._0_4_ * (float)local_158._0_4_ + local_160;
  fVar20 = (float)local_118._0_4_ * (float)local_158._0_4_ + local_940;
  uVar10 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_108._0_4_ * local_938 + local_160;
  fVar22 = (float)local_118._0_4_ * local_938 + local_940;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar10 & (uint)fVar20 | (uint)fVar18 & uVar10)) *
           (local_938 - (float)local_158._0_4_);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_93c / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,(string *)local_930,&local_588,&local_1a0,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"SampleTemporalStability","")
  ;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"Sample temporal stability","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"%","");
  fVar18 = (float)local_58._0_4_ * local_164 + local_174;
  fVar20 = (float)local_68._0_4_ * local_164 + local_170;
  uVar10 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_58._0_4_ * local_168 + local_174;
  fVar22 = (float)local_68._0_4_ * local_168 + local_170;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar10 & (uint)fVar20 | (uint)fVar18 & uVar10)) * (local_168 - local_164);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_16c / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_1c0,&local_1e0,&local_200,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"ApproximatedConstantCost","");
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"Approximated contant cost","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_9a8,&local_220,&local_240,&local_508,QP_KEY_TAG_TIME,local_47c.offset);
  tcu::TestLog::writeFloat
            (log,local_9a8.m_name._M_dataplus._M_p,local_9a8.m_desc._M_dataplus._M_p,
             local_9a8.m_unit._M_dataplus._M_p,local_9a8.m_tag,local_9a8.m_value);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"ApproximatedConstantCostConfidence60Lower","");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,"Approximated contant cost 60% confidence lower limit","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_7d0,&local_260,&local_280,&local_528,QP_KEY_TAG_TIME,
             local_47c.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_7d0.m_name._M_dataplus._M_p,local_7d0.m_desc._M_dataplus._M_p,
             local_7d0.m_unit._M_dataplus._M_p,local_7d0.m_tag,local_7d0.m_value);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,"ApproximatedConstantCostConfidence60Upper","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Approximated contant cost 60% confidence upper limit","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_838,&local_2a0,&local_2c0,&local_2e0,QP_KEY_TAG_TIME,
             local_47c.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_838.m_name._M_dataplus._M_p,local_838.m_desc._M_dataplus._M_p,
             local_838.m_unit._M_dataplus._M_p,local_838.m_tag,local_838.m_value);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ApproximatedLinearCost","");
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e0,"Approximated linear cost","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_5f0,&local_300,&local_6e0,&local_548,QP_KEY_TAG_TIME,
             local_47c.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_5f0.m_name._M_dataplus._M_p,local_5f0.m_desc._M_dataplus._M_p,
             local_5f0.m_unit._M_dataplus._M_p,local_5f0.m_tag,local_5f0.m_value);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,"ApproximatedLinearCostConfidence60Lower","");
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,"Approximated linear cost 60% confidence lower limit","");
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_910,&local_320,&local_340,&local_360,QP_KEY_TAG_TIME,
             local_47c.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_910.m_name._M_dataplus._M_p,local_910.m_desc._M_dataplus._M_p,
             local_910.m_unit._M_dataplus._M_p,local_910.m_tag,local_910.m_value);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_380,"ApproximatedLinearCostConfidence60Upper","");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"Approximated linear cost 60% confidence upper limit","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_768,&local_380,&local_700,&local_568,QP_KEY_TAG_TIME,
             local_47c.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_768.m_name._M_dataplus._M_p,local_768.m_desc._M_dataplus._M_p,
             local_768.m_unit._M_dataplus._M_p,local_768.m_tag,local_768.m_value);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"ApproximatedProcessRate","")
  ;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,"Approximated processing rate","");
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"MB / s","");
  fVar18 = fVar19 / ((local_178 / 1000.0) / 1000.0);
  local_158 = ZEXT416((uint)fVar18);
  tcu::LogNumber<float>::LogNumber
            (&local_658,&local_3a0,&local_3c0,&local_3e0,QP_KEY_TAG_PERFORMANCE,
             fVar18 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_658.m_name._M_dataplus._M_p,local_658.m_desc._M_dataplus._M_p,
             local_658.m_unit._M_dataplus._M_p,local_658.m_tag,local_658.m_value);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_400,"ApproximatedProcessRateNoConstant","");
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420,"Approximated processing rate without constant cost","");
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_8a8,&local_400,&local_420,&local_440,QP_KEY_TAG_PERFORMANCE,
             (fVar19 / ((local_17c / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_8a8.m_name._M_dataplus._M_p,local_8a8.m_desc._M_dataplus._M_p,
             local_8a8.m_unit._M_dataplus._M_p,local_8a8.m_tag,local_8a8.m_value);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"SampleMedianTime","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Median sample time","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_6c0,&local_460,&local_138,&local_88,QP_KEY_TAG_TIME,
             (local_15c - (float)(int)local_48) * local_840 +
             local_83c * (1.0 - (local_15c - (float)(int)local_48)));
  tcu::TestLog::writeFloat
            (log,local_6c0.m_name._M_dataplus._M_p,local_6c0.m_desc._M_dataplus._M_p,
             local_6c0.m_unit._M_dataplus._M_p,local_6c0.m_tag,local_6c0.m_value);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SampleMedianProcess","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Median processing rate","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MB / s","");
  local_f8._0_4_ = (float)local_f8._0_4_ + local_934;
  fVar18 = 0.0009765625;
  tcu::LogNumber<float>::LogNumber
            (&local_4e8,&local_a8,&local_c8,&local_e8,QP_KEY_TAG_PERFORMANCE,
             (float)local_f8._0_4_ * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_4e8.m_name._M_dataplus._M_p,local_4e8.m_desc._M_dataplus._M_p,
             local_4e8.m_unit._M_dataplus._M_p,local_4e8.m_tag,local_4e8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_unit._M_dataplus._M_p != &local_4e8.m_unit.field_2) {
    operator_delete(local_4e8.m_unit._M_dataplus._M_p,
                    local_4e8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_desc._M_dataplus._M_p != &local_4e8.m_desc.field_2) {
    operator_delete(local_4e8.m_desc._M_dataplus._M_p,
                    local_4e8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.m_name._M_dataplus._M_p != &local_4e8.m_name.field_2) {
    operator_delete(local_4e8.m_name._M_dataplus._M_p,
                    CONCAT17(local_4e8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_4e8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_4e8.m_name.field_2._M_local_buf[2],
                                               local_4e8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_unit._M_dataplus._M_p != &local_6c0.m_unit.field_2) {
    operator_delete(local_6c0.m_unit._M_dataplus._M_p,
                    local_6c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_desc._M_dataplus._M_p != &local_6c0.m_desc.field_2) {
    operator_delete(local_6c0.m_desc._M_dataplus._M_p,
                    local_6c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    local_6c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,
                    CONCAT53(local_460.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_460.field_2._M_local_buf[2],
                                      local_460.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_unit._M_dataplus._M_p != &local_8a8.m_unit.field_2) {
    operator_delete(local_8a8.m_unit._M_dataplus._M_p,
                    local_8a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_desc._M_dataplus._M_p != &local_8a8.m_desc.field_2) {
    operator_delete(local_8a8.m_desc._M_dataplus._M_p,
                    local_8a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8.m_name._M_dataplus._M_p != &local_8a8.m_name.field_2) {
    operator_delete(local_8a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a8.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8a8.m_name.field_2._M_local_buf[6],
                                      local_8a8.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,
                    CONCAT17(local_420.field_2._M_local_buf[7],
                             local_420.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT53(local_400.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_400.field_2._M_local_buf[2],
                                      local_400.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_unit._M_dataplus._M_p != &local_658.m_unit.field_2) {
    operator_delete(local_658.m_unit._M_dataplus._M_p,
                    local_658.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_desc._M_dataplus._M_p != &local_658.m_desc.field_2) {
    operator_delete(local_658.m_desc._M_dataplus._M_p,
                    local_658.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT44(local_658.m_name.field_2._M_allocated_capacity._4_4_,
                             local_658.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT17(local_3e0.field_2._M_local_buf[7],
                             local_3e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,
                    CONCAT53(local_3a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3a0.field_2._M_local_buf[2],
                                      local_3a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_unit._M_dataplus._M_p != &local_768.m_unit.field_2) {
    operator_delete(local_768.m_unit._M_dataplus._M_p,
                    local_768.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_desc._M_dataplus._M_p != &local_768.m_desc.field_2) {
    operator_delete(local_768.m_desc._M_dataplus._M_p,
                    local_768.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    (ulong)(local_768.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,(ulong)(local_568.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,(ulong)(local_700.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_380.field_2._M_local_buf[2],
                                      local_380.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_unit._M_dataplus._M_p != &local_910.m_unit.field_2) {
    operator_delete(local_910.m_unit._M_dataplus._M_p,
                    local_910.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_desc._M_dataplus._M_p != &local_910.m_desc.field_2) {
    operator_delete(local_910.m_desc._M_dataplus._M_p,
                    local_910.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_910.m_name.field_2._M_local_buf[6],
                                      local_910.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,
                    CONCAT17(local_360.field_2._M_local_buf[7],
                             local_360.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT17(local_340.field_2._M_local_buf[7],
                             local_340.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,
                    CONCAT53(local_320.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_320.field_2._M_local_buf[2],
                                      local_320.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_unit._M_dataplus._M_p != &local_5f0.m_unit.field_2) {
    operator_delete(local_5f0.m_unit._M_dataplus._M_p,
                    local_5f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_desc._M_dataplus._M_p != &local_5f0.m_desc.field_2) {
    operator_delete(local_5f0.m_desc._M_dataplus._M_p,
                    local_5f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,(ulong)(local_6e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,
                    CONCAT53(local_300.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_300.field_2._M_local_buf[2],
                                      local_300.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT53(local_2a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2a0.field_2._M_local_buf[2],
                                      local_2a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_unit._M_dataplus._M_p != &local_9a8.m_unit.field_2) {
    operator_delete(local_9a8.m_unit._M_dataplus._M_p,
                    local_9a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_desc._M_dataplus._M_p != &local_9a8.m_desc.field_2) {
    operator_delete(local_9a8.m_desc._M_dataplus._M_p,
                    local_9a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8.m_name._M_dataplus._M_p != &local_9a8.m_name.field_2) {
    operator_delete(local_9a8.m_name._M_dataplus._M_p,
                    local_9a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,(ulong)(local_508.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT17(local_240.field_2._M_local_buf[7],
                             local_240.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT26(local_220.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_220.field_2._M_allocated_capacity._4_2_,
                                      local_220.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT35(local_200.field_2._M_allocated_capacity._5_3_,
                             local_200.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT26(local_1c0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_1c0.field_2._M_allocated_capacity._4_2_,
                                      local_1c0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT26(local_1a0.field_2._M_allocated_capacity._6_2_,
                             local_1a0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT44(local_920._M_allocated_capacity._4_4_,
                             local_920._M_allocated_capacity._0_4_) + 1);
  }
  tcu::TestLog::endSection(local_140.m_log);
  RVar23.renderRateAtRange = (float)local_158._0_4_;
  RVar23.renderRateMedian = (float)local_f8._0_4_;
  RVar23.renderRateAtInfinity = fVar18;
  return RVar23;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}